

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O1

void extended_hdlr(MCInst *MI,m680x_info *info,uint16_t *address)

{
  byte bVar1;
  cs_m680x_op *op;
  
  bVar1 = (info->m680x).op_count;
  (info->m680x).op_count = bVar1 + 1;
  op = (info->m680x).operands + bVar1;
  op->type = M680X_OP_EXTENDED;
  set_operand_size(info,op,(uint8_t)address);
  read_word(info,(uint16_t *)&(info->m680x).operands[bVar1].field_1.reg,*address);
  *address = *address + 2;
  return;
}

Assistant:

static void extended_hdlr(MCInst *MI, m680x_info *info, uint16_t *address)
{
	cs_m680x *m680x = &info->m680x;
	cs_m680x_op *op = &m680x->operands[m680x->op_count++];

	op->type = M680X_OP_EXTENDED;
	set_operand_size(info, op, 1);
	read_word(info, &op->ext.address, *address);
	*address += 2;
}